

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonLabelCompareEscaped(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  byte bVar1;
  u32 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  u32 cRight;
  u32 cLeft;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cLeft = 0xaaaaaaaa;
  cRight = 0xaaaaaaaa;
  while( true ) {
    if (nLeft == 0) {
      cLeft = 0;
      nLeft = 0;
    }
    else {
      bVar1 = *zLeft;
      if ((rawLeft == 0) && (bVar1 == 0x5c)) {
        uVar2 = jsonUnescapeOneChar(zLeft,nLeft,&cLeft);
        zLeft = (char *)((byte *)zLeft + uVar2);
        nLeft = nLeft - uVar2;
      }
      else {
        cLeft = (u32)bVar1;
        if (bVar1 < 0xc0) {
          zLeft = (char *)((byte *)zLeft + 1);
          nLeft = nLeft - 1;
        }
        else {
          iVar3 = sqlite3Utf8ReadLimited((u8 *)zLeft,nLeft,&cLeft);
          zLeft = (char *)((byte *)zLeft + iVar3);
          nLeft = nLeft - iVar3;
        }
      }
    }
    if (nRight == 0) {
      cRight = 0;
      nRight = 0;
    }
    else {
      bVar1 = *zRight;
      if ((rawRight == 0) && (bVar1 == 0x5c)) {
        uVar2 = jsonUnescapeOneChar(zRight,nRight,&cRight);
        zRight = (char *)((byte *)zRight + uVar2);
        nRight = nRight - uVar2;
      }
      else {
        cRight = (u32)bVar1;
        if (bVar1 < 0xc0) {
          zRight = (char *)((byte *)zRight + 1);
          nRight = nRight - 1;
        }
        else {
          iVar3 = sqlite3Utf8ReadLimited((u8 *)zRight,nRight,&cRight);
          zRight = (char *)((byte *)zRight + iVar3);
          nRight = nRight - iVar3;
        }
      }
    }
    if (cLeft != cRight) break;
    if (cLeft == 0) {
      iVar3 = 1;
LAB_001a4a29:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar3;
      }
      __stack_chk_fail();
    }
  }
  iVar3 = 0;
  goto LAB_001a4a29;
}

Assistant:

static SQLITE_NOINLINE int jsonLabelCompareEscaped(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  u32 cLeft, cRight;
  assert( rawLeft==0 || rawRight==0 );
  while( 1 /*exit-by-return*/ ){
    if( nLeft==0 ){
      cLeft = 0;
    }else if( rawLeft || zLeft[0]!='\\' ){
      cLeft = ((u8*)zLeft)[0];
      if( cLeft>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zLeft, nLeft, &cLeft);
        zLeft += sz;
        nLeft -= sz;
      }else{
        zLeft++;
        nLeft--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zLeft, nLeft, &cLeft);
      zLeft += n;
      assert( n<=nLeft );
      nLeft -= n;
    }
    if( nRight==0 ){
      cRight = 0;
    }else if( rawRight || zRight[0]!='\\' ){
      cRight = ((u8*)zRight)[0];
      if( cRight>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zRight, nRight, &cRight);
        zRight += sz;
        nRight -= sz;
      }else{
        zRight++;
        nRight--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zRight, nRight, &cRight);
      zRight += n;
      assert( n<=nRight );
      nRight -= n;
    }
    if( cLeft!=cRight ) return 0;
    if( cLeft==0 ) return 1;
  }
}